

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O1

void finish_pass1(j_decompress_ptr cinfo)

{
  uint uVar1;
  jpeg_color_quantizer *pjVar2;
  jpeg_error_mgr *pjVar3;
  boxptr boxp_00;
  ulong uVar4;
  long lVar5;
  boxptr pbVar6;
  long lVar7;
  boxptr boxp;
  long lVar8;
  int iVar9;
  ulong uVar10;
  boxptr which;
  boxptr boxp_01;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  char cVar15;
  int iVar16;
  int *piVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  bool bVar22;
  
  pjVar2 = cinfo->cquantize;
  cinfo->colormap = (JSAMPARRAY)pjVar2[1].start_pass;
  uVar1 = *(uint *)&pjVar2[1].color_quantize;
  uVar10 = (ulong)(int)uVar1;
  uVar20 = 1;
  boxp_00 = (boxptr)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,uVar10 * 0x28);
  boxp_00->c0min = 0;
  boxp_00->c0max = 0x1f;
  boxp_00->c1min = 0;
  boxp_00->c1max = 0x3f;
  boxp_00->c2min = 0;
  boxp_00->c2max = 0x1f;
  update_box(cinfo,boxp_00);
  if (1 < (long)uVar10) {
    uVar20 = 1;
    do {
      if (uVar20 * 2 < uVar10 || uVar20 * 2 - uVar10 == 0) {
        boxp_01 = (boxptr)0x0;
        lVar11 = 0;
        uVar4 = uVar20;
        pbVar6 = boxp_00;
        do {
          if ((lVar11 < pbVar6->colorcount) && (0 < pbVar6->volume)) {
            lVar11 = pbVar6->colorcount;
            boxp_01 = pbVar6;
          }
          pbVar6 = pbVar6 + 1;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      else {
        boxp_01 = (boxptr)0x0;
        lVar11 = 0;
        uVar4 = uVar20;
        pbVar6 = boxp_00;
        do {
          if (lVar11 < pbVar6->volume) {
            boxp_01 = pbVar6;
            lVar11 = pbVar6->volume;
          }
          pbVar6 = pbVar6 + 1;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      if (boxp_01 == (boxptr)0x0) goto LAB_0010ad6a;
      boxp_00[uVar20].c0max = boxp_01->c0max;
      boxp_00[uVar20].c1max = boxp_01->c1max;
      boxp_00[uVar20].c2max = boxp_01->c2max;
      boxp_00[uVar20].c0min = boxp_01->c0min;
      boxp_00[uVar20].c1min = boxp_01->c1min;
      boxp_00[uVar20].c2min = boxp_01->c2min;
      iVar9 = (boxp_01->c0max - boxp_01->c0min) * 0x10;
      iVar16 = boxp_01->c1max - boxp_01->c1min;
      iVar13 = iVar16 * 0xc;
      bVar22 = iVar9 + iVar16 * -0xc < 0;
      iVar16 = iVar9;
      if (iVar9 == iVar13 || SBORROW4(iVar9,iVar13) != bVar22) {
        iVar16 = iVar13;
      }
      cVar15 = iVar9 == iVar13 || SBORROW4(iVar9,iVar13) != bVar22;
      if (iVar16 < (boxp_01->c2max - boxp_01->c2min) * 8) {
        cVar15 = '\x02';
      }
      if (cVar15 == '\x02') {
        piVar17 = &boxp_01->c2max;
        pbVar6 = (boxptr)&boxp_00[uVar20].c2min;
        iVar13 = boxp_01->c2min + boxp_01->c2max;
      }
      else if (cVar15 == '\x01') {
        piVar17 = &boxp_01->c1max;
        iVar13 = boxp_01->c1min + boxp_01->c1max;
        pbVar6 = (boxptr)&boxp_00[uVar20].c1min;
      }
      else {
        piVar17 = &boxp_01->c0max;
        iVar13 = boxp_01->c0min + boxp_01->c0max;
        pbVar6 = boxp_00 + uVar20;
      }
      *piVar17 = iVar13 / 2;
      pbVar6->c0min = iVar13 / 2 + 1;
      update_box(cinfo,boxp_01);
      update_box(cinfo,boxp_00 + uVar20);
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar10);
    uVar20 = (ulong)uVar1;
  }
LAB_0010ad6a:
  iVar13 = (int)uVar20;
  if (0 < iVar13) {
    uVar10 = 0;
    do {
      lVar11 = (long)boxp_00[uVar10].c0min;
      if (boxp_00[uVar10].c0max < boxp_00[uVar10].c0min) {
        lVar18 = 0;
        lVar5 = 0;
        lVar7 = 0;
        lVar19 = 0;
      }
      else {
        iVar16 = boxp_00[uVar10].c2min;
        iVar9 = boxp_00[uVar10].c1min;
        lVar19 = 0;
        lVar7 = 0;
        lVar5 = 0;
        lVar18 = 0;
        do {
          if (iVar9 <= boxp_00[uVar10].c1max) {
            lVar14 = *(long *)(cinfo->cquantize[1].finish_pass + lVar11 * 8) +
                     (long)iVar9 * 0x40 + (long)iVar16 * 2;
            lVar12 = (long)iVar9;
            do {
              if (iVar16 <= boxp_00[uVar10].c2max) {
                lVar8 = 0;
                iVar21 = iVar16 * 8 + 4;
                do {
                  uVar4 = (ulong)*(ushort *)(lVar14 + lVar8 * 2);
                  if (uVar4 != 0) {
                    lVar18 = lVar18 + uVar4;
                    lVar5 = lVar5 + uVar4 * (long)((int)lVar11 * 8 + 4);
                    lVar7 = lVar7 + uVar4 * (long)((int)lVar12 * 4 + 2);
                    lVar19 = lVar19 + (long)iVar21 * uVar4;
                  }
                  lVar8 = lVar8 + 1;
                  iVar21 = iVar21 + 8;
                } while ((boxp_00[uVar10].c2max - iVar16) + 1 != (int)lVar8);
              }
              lVar12 = lVar12 + 1;
              lVar14 = lVar14 + 0x40;
            } while (boxp_00[uVar10].c1max + 1 != (int)lVar12);
          }
          lVar11 = lVar11 + 1;
        } while (boxp_00[uVar10].c0max + 1 != (int)lVar11);
      }
      lVar11 = lVar18 >> 1;
      (*cinfo->colormap)[uVar10] = (JSAMPLE)((lVar5 + lVar11) / lVar18);
      cinfo->colormap[1][uVar10] = (JSAMPLE)((lVar7 + lVar11) / lVar18);
      cinfo->colormap[2][uVar10] = (JSAMPLE)((lVar11 + lVar19) / lVar18);
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uVar20 & 0xffffffff));
  }
  cinfo->actual_number_of_colors = iVar13;
  pjVar3 = cinfo->err;
  pjVar3->msg_code = 0x62;
  (pjVar3->msg_parm).i[0] = iVar13;
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  *(undefined4 *)&pjVar2[1].new_color_map = 1;
  return;
}

Assistant:

METHODDEF(void)
finish_pass1 (j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;

  /* Select the representative colors and fill in cinfo->colormap */
  cinfo->colormap = cquantize->sv_colormap;
  select_colors(cinfo, cquantize->desired);
  /* Force next pass to zero the color index table */
  cquantize->needs_zeroed = TRUE;
}